

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_bds.cpp
# Opt level: O2

void BDS::ComputeSyncAofs
               (MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,MultiFab *umac
               ,MultiFab *vmac,MultiFab *wmac,MultiFab *ucorr,MultiFab *vcorr,MultiFab *wcorr,
               MultiFab *xedge,MultiFab *yedge,MultiFab *zedge,int edge_comp,bool known_edgestate,
               MultiFab *xfluxes,MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,MultiFab *fq,
               int fq_comp,MultiFab *divu,BCRec *d_bc,Geometry *geom,DeviceVector<int> *iconserv,
               Real dt,bool is_velocity)

{
  int *piVar1;
  Geometry geom_00;
  int i;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  Geometry *pGVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  int k;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  byte bVar15;
  undefined1 auVar16 [88];
  undefined1 auVar17 [48];
  undefined1 in_stack_fffffffffffffa00 [160];
  undefined1 auVar18 [24];
  undefined8 in_stack_fffffffffffffaa0;
  Array4<const_double> *in_stack_fffffffffffffaa8;
  Array4<double> *in_stack_fffffffffffffab0;
  Array4<const_double> *in_stack_fffffffffffffab8;
  Array4<const_double> *in_stack_fffffffffffffac0;
  int ncomp_00;
  Box local_50c;
  ulong local_4f0;
  Array4<const_double> local_4e8;
  Array4<const_double> local_4a8;
  pointer local_468;
  FabArray<amrex::FArrayBox> *local_460;
  FabArray<amrex::FArrayBox> *local_458;
  Real local_450;
  FabArray<amrex::FArrayBox> *local_448;
  long local_440;
  long local_438;
  long local_430;
  ulong local_428;
  ulong local_420;
  long local_418;
  long local_410;
  long local_408;
  long local_400;
  Array4<const_double> local_3f8;
  Array4<const_double> local_3b8;
  FArrayBox tmpfab;
  Elixir eli;
  Box tmpbox;
  Array4<double> local_2d0;
  Array4<double> local_290;
  Array4<double> local_250;
  Array4<double> local_210;
  Array4<double> local_1d0;
  Array4<double> local_190;
  MFIter mfi;
  Array4<const_double> local_f0;
  Array4<const_double> local_b0;
  Array4<const_double> local_70;
  
  bVar15 = 0;
  uVar4 = (ulong)(uint)ncomp;
  local_468 = iconserv->m_data;
  local_460 = &state->super_FabArray<amrex::FArrayBox>;
  local_458 = &umac->super_FabArray<amrex::FArrayBox>;
  local_450 = dt;
  local_448 = &aofs->super_FabArray<amrex::FArrayBox>;
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)aofs,true);
  local_4f0 = uVar4;
  local_428 = 0;
  if (0 < ncomp) {
    local_428 = uVar4;
  }
  while( true ) {
    if (mfi.endIndex <= mfi.currentIndex) break;
    amrex::MFIter::tilebox(&local_50c,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_190,&xfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_1d0,&yfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_210,&zfluxes->super_FabArray<amrex::FArrayBox>,&mfi,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_250,&xedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_290,&yedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_2d0,&zedge->super_FabArray<amrex::FArrayBox>,&mfi,edge_comp);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_70,&ucorr->super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_b0,&vcorr->super_FabArray<amrex::FArrayBox>,&mfi);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_f0,&wcorr->super_FabArray<amrex::FArrayBox>,&mfi);
    if (!known_edgestate) {
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&tmpfab,local_458,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_4a8,&vmac->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_4e8,&wmac->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_3f8,local_460,&mfi,state_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_3b8,&divu->super_FabArray<amrex::FArrayBox>,&mfi);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&tmpbox,&fq->super_FabArray<amrex::FArrayBox>,&mfi,fq_comp)
      ;
      pGVar5 = geom;
      puVar6 = (undefined8 *)&stack0xfffffffffffffa00;
      for (lVar2 = 0x19; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar6 = *(undefined8 *)&pGVar5->super_CoordSys;
        pGVar5 = (Geometry *)((long)pGVar5 + (ulong)bVar15 * -0x10 + 8);
        puVar6 = puVar6 + (ulong)bVar15 * -2 + 1;
      }
      geom_00.roundoff_hi_f.arr[0] = (float)(int)in_stack_fffffffffffffaa0;
      geom_00.roundoff_hi_f.arr[1] = (float)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20);
      auVar16 = in_stack_fffffffffffffa00._0_88_;
      auVar17 = in_stack_fffffffffffffa00._88_48_;
      auVar18 = in_stack_fffffffffffffa00._136_24_;
      geom_00.super_CoordSys.c_sys = auVar16._0_4_;
      geom_00.super_CoordSys._4_4_ = auVar16._4_4_;
      geom_00.super_CoordSys.offset[0] = (Real)auVar16._8_8_;
      geom_00.super_CoordSys.offset[1] = (Real)auVar16._16_8_;
      geom_00.super_CoordSys.offset[2] = (Real)auVar16._24_8_;
      geom_00.super_CoordSys.dx[0] = (Real)auVar16._32_8_;
      geom_00.super_CoordSys.dx[1] = (Real)auVar16._40_8_;
      geom_00.super_CoordSys.dx[2] = (Real)auVar16._48_8_;
      geom_00.super_CoordSys.inv_dx[0] = (Real)auVar16._56_8_;
      geom_00.super_CoordSys.inv_dx[1] = (Real)auVar16._64_8_;
      geom_00.super_CoordSys.inv_dx[2] = (Real)auVar16._72_8_;
      geom_00.super_CoordSys.ok = (bool)auVar16[0x50];
      geom_00.super_CoordSys._81_7_ = auVar16._81_7_;
      geom_00.prob_domain.xlo[0] = (Real)auVar17._0_8_;
      geom_00.prob_domain.xlo[1] = (Real)auVar17._8_8_;
      geom_00.prob_domain.xlo[2] = (Real)auVar17._16_8_;
      geom_00.prob_domain.xhi[0] = (Real)auVar17._24_8_;
      geom_00.prob_domain.xhi[1] = (Real)auVar17._32_8_;
      geom_00.prob_domain.xhi[2] = (Real)auVar17._40_8_;
      geom_00.roundoff_hi_d.arr[0] = (double)auVar18._0_8_;
      geom_00.roundoff_hi_d.arr[1] = (double)auVar18._8_8_;
      geom_00.roundoff_hi_d.arr[2] = (double)auVar18._16_8_;
      geom_00._168_8_ = in_stack_fffffffffffffaa8;
      geom_00.domain.smallend.vect._4_8_ = in_stack_fffffffffffffab0;
      geom_00.domain.bigend.vect._0_8_ = in_stack_fffffffffffffab8;
      geom_00.domain._20_8_ = in_stack_fffffffffffffac0;
      ComputeEdgeState(&local_50c,(int)local_4f0,&local_3f8,&local_250,&local_290,&local_2d0,
                       (Array4<const_double> *)&tmpfab,&local_4a8,&local_4e8,&local_3b8,
                       (Array4<const_double> *)&tmpbox,geom_00,local_450,d_bc,local_468,is_velocity)
      ;
    }
    tmpbox.bigend.vect[2] = local_50c.bigend.vect[2];
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      if ((local_50c.btype.itype >> ((uint)lVar2 & 0x1f) & 1) == 0) {
        piVar1 = tmpbox.bigend.vect + lVar2;
        *piVar1 = *piVar1 + 1;
      }
    }
    tmpbox.btype.itype = 7;
    amrex::FArrayBox::FArrayBox
              ((FArrayBox *)&tmpfab.super_BaseFab<double>,&tmpbox,ncomp * 3,true,false,(Arena *)0x0)
    ;
    amrex::BaseFab<double>::elixir<double,_0>(&eli,&tmpfab.super_BaseFab<double>);
    local_4a8.begin.x = tmpfab.super_BaseFab<double>.domain.smallend.vect[0];
    local_4a8.begin.y = tmpfab.super_BaseFab<double>.domain.smallend.vect[1];
    local_4a8.p = tmpfab.super_BaseFab<double>.dptr;
    local_4a8.jstride =
         ((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[0] -
         (long)tmpfab.super_BaseFab<double>.domain.smallend.vect[0]) + 1;
    local_4a8.kstride =
         (((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[1] + 1) -
         (long)tmpfab.super_BaseFab<double>.domain.smallend.vect[1]) * local_4a8.jstride;
    local_4a8.nstride =
         (((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[2] + 1) -
         (long)tmpfab.super_BaseFab<double>.domain.smallend.vect[2]) * local_4a8.kstride;
    local_4a8.begin.z = tmpfab.super_BaseFab<double>.domain.smallend.vect[2];
    local_4a8.end._0_8_ =
         (long)tmpfab.super_BaseFab<double>.domain.bigend.vect[0] + 1U & 0xffffffff |
         (long)tmpfab.super_BaseFab<double>.domain.bigend.vect[1] + 1 << 0x20;
    local_4a8.end.z = (int)((long)tmpfab.super_BaseFab<double>.domain.bigend.vect[2] + 1);
    local_4a8.ncomp = tmpfab.super_BaseFab<double>.nvar;
    local_4e8.p = local_250.p;
    local_4e8.jstride = local_250.jstride;
    local_4e8.kstride = local_250.kstride;
    local_4e8.nstride = local_250.nstride;
    local_4e8.begin.z = local_250.begin.z;
    local_4e8.begin.x = local_250.begin.x;
    local_4e8.begin.y = local_250.begin.y;
    local_4e8.end.z = local_250.end.z;
    local_4e8.end.x = local_250.end.x;
    local_4e8.end.y = local_250.end.y;
    local_4e8.ncomp = local_250.ncomp;
    local_3f8.p = local_290.p;
    local_3f8.jstride = local_290.jstride;
    local_3f8.kstride = local_290.kstride;
    local_3f8.nstride = local_290.nstride;
    local_3f8.begin.z = local_290.begin.z;
    local_3f8.begin.x = local_290.begin.x;
    local_3f8.begin.y = local_290.begin.y;
    local_3f8.end.z = local_290.end.z;
    local_3f8.end.x = local_290.end.x;
    local_3f8.end.y = local_290.end.y;
    local_3f8.ncomp = local_290.ncomp;
    local_3b8.p = local_2d0.p;
    local_3b8.jstride = local_2d0.jstride;
    local_3b8.kstride = local_2d0.kstride;
    local_3b8.nstride = local_2d0.nstride;
    local_3b8.begin.z = local_2d0.begin.z;
    local_3b8.begin.x = local_2d0.begin.x;
    local_3b8.begin.y = local_2d0.begin.y;
    local_3b8.end.z = local_2d0.end.z;
    local_3b8.end.x = local_2d0.end.x;
    local_3b8.end.y = local_2d0.end.y;
    local_3b8.ncomp = local_2d0.ncomp;
    in_stack_fffffffffffffab8 = &local_3f8;
    in_stack_fffffffffffffaa8 = &local_f0;
    in_stack_fffffffffffffaa0 = 0x38e0ec;
    ncomp_00 = (int)local_4f0;
    in_stack_fffffffffffffab0 = (Array4<double> *)&local_4e8;
    in_stack_fffffffffffffac0 = &local_3b8;
    HydroUtils::ComputeFluxes
              (&local_50c,&local_190,&local_1d0,&local_210,&local_70,&local_b0,
               in_stack_fffffffffffffaa8,&local_4e8,in_stack_fffffffffffffab8,&local_3b8,geom,
               ncomp_00,true);
    local_4e8.p = local_190.p;
    local_4e8.jstride = local_190.jstride;
    local_4e8.kstride = local_190.kstride;
    local_4e8.nstride = local_190.nstride;
    local_4e8.begin.z = local_190.begin.z;
    local_4e8.begin.x = local_190.begin.x;
    local_4e8.begin.y = local_190.begin.y;
    local_4e8.end.z = local_190.end.z;
    local_4e8.end.x = local_190.end.x;
    local_4e8.end.y = local_190.end.y;
    local_4e8.ncomp = local_190.ncomp;
    local_3f8.p = local_1d0.p;
    local_3f8.jstride = local_1d0.jstride;
    local_3f8.kstride = local_1d0.kstride;
    local_3f8.nstride = local_1d0.nstride;
    local_3f8.begin.z = local_1d0.begin.z;
    local_3f8.begin.x = local_1d0.begin.x;
    local_3f8.begin.y = local_1d0.begin.y;
    local_3f8.end.z = local_1d0.end.z;
    local_3f8.end.x = local_1d0.end.x;
    local_3f8.end.y = local_1d0.end.y;
    local_3f8.ncomp = local_1d0.ncomp;
    local_3b8.p = local_210.p;
    local_3b8.jstride = local_210.jstride;
    local_3b8.kstride = local_210.kstride;
    local_3b8.nstride = local_210.nstride;
    local_3b8.begin.z = local_210.begin.z;
    local_3b8.begin.x = local_210.begin.x;
    local_3b8.begin.y = local_210.begin.y;
    local_3b8.end.z = local_210.end.z;
    local_3b8.end.x = local_210.end.x;
    local_3b8.end.y = local_210.end.y;
    local_3b8.ncomp = local_210.ncomp;
    HydroUtils::ComputeDivergence
              (&local_50c,(Array4<double> *)&local_4a8,&local_4e8,&local_3f8,&local_3b8,ncomp_00,
               geom,-1.0,true);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&local_4e8,local_448,&mfi,aofs_comp);
    local_400 = (long)local_50c.smallend.vect[1];
    local_440 = (long)local_50c.smallend.vect[2];
    local_408 = local_4e8.kstride * 8;
    local_430 = local_4e8.nstride * 8;
    local_438 = local_4a8.nstride * 8;
    uVar4 = 0;
    lVar2 = (local_400 - local_4a8.begin.y) * local_4a8.jstride * 8 +
            (local_440 - local_4a8.begin.z) * local_4a8.kstride * 8 +
            (long)local_50c.smallend.vect[0] * 8 + (long)local_4a8.begin.x * -8 + (long)local_4a8.p;
    lVar9 = (local_400 - local_4e8.begin.y) * local_4e8.jstride * 8 +
            (local_440 - local_4e8.begin.z) * local_408 + (long)local_50c.smallend.vect[0] * 8 +
            (long)local_4e8.begin.x * -8 + (long)local_4e8.p;
    while (lVar13 = lVar9, lVar7 = lVar2, uVar3 = uVar4, lVar2 = lVar13, lVar9 = lVar7,
          lVar11 = local_440, uVar3 != local_428) {
      for (; lVar10 = local_400, lVar12 = lVar9, lVar14 = lVar2, lVar11 <= local_50c.bigend.vect[2];
          lVar11 = lVar11 + 1) {
        for (; lVar10 <= local_50c.bigend.vect[1]; lVar10 = lVar10 + 1) {
          if (local_50c.smallend.vect[0] <= local_50c.bigend.vect[0]) {
            lVar8 = 0;
            do {
              *(double *)(lVar14 + lVar8 * 8) =
                   *(double *)(lVar14 + lVar8 * 8) - *(double *)(lVar12 + lVar8 * 8);
              lVar8 = lVar8 + 1;
            } while ((local_50c.bigend.vect[0] - local_50c.smallend.vect[0]) + 1 != (int)lVar8);
          }
          lVar14 = lVar14 + local_4e8.jstride * 8;
          lVar12 = lVar12 + local_4a8.jstride * 8;
        }
        lVar2 = lVar2 + local_408;
        lVar9 = lVar9 + local_4a8.kstride * 8;
      }
      lVar2 = lVar7 + local_438;
      lVar9 = lVar13 + local_430;
      local_420 = uVar3;
      local_418 = lVar7;
      local_410 = lVar13;
      uVar4 = uVar3 + 1;
    }
    amrex::Gpu::Device::streamSynchronize();
    amrex::Gpu::Elixir::~Elixir(&eli);
    amrex::BaseFab<double>::~BaseFab(&tmpfab.super_BaseFab<double>);
    amrex::MFIter::operator++(&mfi);
  }
  amrex::MFIter::~MFIter(&mfi);
  return;
}

Assistant:

void
BDS::ComputeSyncAofs ( MultiFab& aofs,
                       const int aofs_comp,
                       const int ncomp,
                       MultiFab const& state,
                       const int state_comp,
                       AMREX_D_DECL( MultiFab const& umac,
                                     MultiFab const& vmac,
                                     MultiFab const& wmac),
                       AMREX_D_DECL( MultiFab const& ucorr,
                                     MultiFab const& vcorr,
                                     MultiFab const& wcorr),
                       AMREX_D_DECL( MultiFab& xedge,
                                     MultiFab& yedge,
                                     MultiFab& zedge),
                       const int  edge_comp,
                       const bool known_edgestate,
                       AMREX_D_DECL( MultiFab& xfluxes,
                                     MultiFab& yfluxes,
                                     MultiFab& zfluxes),
                       int fluxes_comp,
                       MultiFab const& fq,
                       const int fq_comp,
                       MultiFab const& divu,
                       BCRec const* d_bc,
                       Geometry const& geom,
                       Gpu::DeviceVector<int>& iconserv,
                       const Real dt,
                       const bool is_velocity)
{

    BL_PROFILE("BDS::ComputeSyncAofs()");
    amrex::ignore_unused(divu);

    bool fluxes_are_area_weighted = true;

    int const* iconserv_ptr = iconserv.data();

#if (AMREX_SPACEDIM==2)
    if ( geom.IsRZ() )
    {
        Abort("BDS does not currently support cylindrical coordinates");
    }
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const Box& bx   = mfi.tilebox();

        //
        // Get handlers to Array4
        //
        AMREX_D_TERM( const auto& fx = xfluxes.array(mfi,fluxes_comp);,
                      const auto& fy = yfluxes.array(mfi,fluxes_comp);,
                      const auto& fz = zfluxes.array(mfi,fluxes_comp););

        AMREX_D_TERM( const auto& xed = xedge.array(mfi,edge_comp);,
                      const auto& yed = yedge.array(mfi,edge_comp);,
                      const auto& zed = zedge.array(mfi,edge_comp););

        AMREX_D_TERM( const auto& uc = ucorr.const_array(mfi);,
                      const auto& vc = vcorr.const_array(mfi);,
                      const auto& wc = wcorr.const_array(mfi););

        if ( !known_edgestate ) {

            AMREX_D_TERM( const auto& u = umac.const_array(mfi);,
                          const auto& v = vmac.const_array(mfi);,
                          const auto& w = wmac.const_array(mfi););

            BDS::ComputeEdgeState( bx, ncomp,
                                   state.array(mfi, state_comp),
                                   AMREX_D_DECL(xed,yed,zed),
                                   AMREX_D_DECL(u,v,w),
                                   divu.array(mfi),
                                   fq.array(mfi,fq_comp),
                                   geom, dt, d_bc, iconserv_ptr,
                                   is_velocity);
        }

        // Temporary divergence
        Box tmpbox = amrex::surroundingNodes(bx);
        int tmpcomp = ncomp*AMREX_SPACEDIM;
        FArrayBox tmpfab(tmpbox, tmpcomp);
        Elixir eli = tmpfab.elixir();
        Array4<Real> divtmp_arr = tmpfab.array();

        Real mult = -1.0;

        HydroUtils::ComputeFluxes( bx,
                                   AMREX_D_DECL( fx, fy, fz ),
                                   AMREX_D_DECL( uc, vc, wc ),
                                   AMREX_D_DECL( xed, yed, zed ),
                                   geom, ncomp, fluxes_are_area_weighted );

        HydroUtils::ComputeDivergence( bx, divtmp_arr,
                                       AMREX_D_DECL( fx, fy, fz ),
                                       ncomp, geom,
                                       mult, fluxes_are_area_weighted);

        // Sum contribution to sync aofs
        auto const& aofs_arr = aofs.array(mfi, aofs_comp);

        amrex::ParallelFor(bx, ncomp, [aofs_arr, divtmp_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) += - divtmp_arr( i, j, k, n ); });

        Gpu::streamSynchronize();  // otherwise we might be using too much memory
    }

}